

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

IXML_NodeList * ixmlNode_getChildNodes(IXML_Node_conflict *nodeptr)

{
  IXML_Node_conflict *add;
  int iVar1;
  IXML_NodeList *nList;
  IXML_NodeList *newNodeList;
  IXML_NodeList *local_18;
  
  if ((nodeptr == (IXML_Node_conflict *)0x0) ||
     (nList = (IXML_NodeList *)malloc(0x10), nList == (IXML_NodeList *)0x0)) {
LAB_00105df8:
    nList = (IXML_NodeList *)0x0;
  }
  else {
    local_18 = nList;
    ixmlNodeList_init(nList);
    for (add = nodeptr->firstChild; add != (IXML_Node_conflict *)0x0; add = add->nextSibling) {
      iVar1 = ixmlNodeList_addToNodeList(&local_18,add);
      if (iVar1 != 0) {
        ixmlNodeList_free(local_18);
        goto LAB_00105df8;
      }
      nList = local_18;
    }
  }
  return nList;
}

Assistant:

IXML_NodeList *ixmlNode_getChildNodes(IXML_Node *nodeptr)
{
	IXML_Node *tempNode;
	IXML_NodeList *newNodeList;
	int rc;

	if (nodeptr == NULL) {
		return NULL;
	}

	newNodeList = (IXML_NodeList *)malloc(sizeof(IXML_NodeList));
	if (newNodeList == NULL) {
		return NULL;
	}

	ixmlNodeList_init(newNodeList);
	tempNode = nodeptr->firstChild;
	while (tempNode != NULL) {
		rc = ixmlNodeList_addToNodeList(&newNodeList, tempNode);
		if (rc != IXML_SUCCESS) {
			ixmlNodeList_free(newNodeList);
			return NULL;
		}

		tempNode = tempNode->nextSibling;
	}

	return newNodeList;
}